

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O3

size_t http_time2str(char *target,time_t t)

{
  time_t timer;
  size_t __n;
  size_t sVar1;
  char *target_00;
  long *in_FS_OFFSET;
  timespec tVar2;
  tm_conflict tm;
  tm_conflict local_50;
  
  tVar2 = fio_last_tick();
  timer = tVar2.tv_sec;
  if ((long)(t | 7U) < timer) {
    http_gmtime(t,&local_50);
    __n = http_date2rfc7231(target,&local_50);
  }
  else {
    if (in_FS_OFFSET[-0xc] < timer) {
      in_FS_OFFSET[-0xc] = timer;
      http_gmtime(timer,&local_50);
      target_00 = (char *)(*in_FS_OFFSET + -0x50);
      sVar1 = http_date2rfc7231(target_00,&local_50);
      in_FS_OFFSET[-4] = sVar1;
    }
    else {
      target_00 = (char *)(*in_FS_OFFSET + -0x50);
    }
    __n = in_FS_OFFSET[-4];
    memcpy(target,target_00,__n);
  }
  return __n;
}

Assistant:

size_t http_time2str(char *target, const time_t t) {
  /* pre-print time every 1 or 2 seconds or so. */
  static __thread time_t cached_tick;
  static __thread char cached_httpdate[48];
  static __thread size_t cached_len;
  time_t last_tick = fio_last_tick().tv_sec;
  if ((t | 7) < last_tick) {
    /* this is a custom time, not "now", pass through */
    struct tm tm;
    http_gmtime(t, &tm);
    return http_date2str(target, &tm);
  }
  if (last_tick > cached_tick) {
    struct tm tm;
    cached_tick = last_tick; /* refresh every second */
    http_gmtime(last_tick, &tm);
    cached_len = http_date2str(cached_httpdate, &tm);
  }
  memcpy(target, cached_httpdate, cached_len);
  return cached_len;
}